

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test::TestBody
          (InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  char *pcVar6;
  char *in_R9;
  Value value;
  string brJsonSameXPanDifferentDomains;
  string brJsonSameXPanDifferentNwkNames;
  string brJsonSameAddr;
  TestContext ctx;
  AssertHelper local_2d8;
  undefined8 *local_2d0;
  Error local_2c8;
  string local_298;
  undefined1 local_270 [8];
  _Alloc_hider local_268;
  undefined1 local_260 [8];
  char local_258 [16];
  _Alloc_hider local_248;
  char local_238 [16];
  Expression local_228;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  string local_1c0;
  string local_1a0;
  string local_180;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n    },\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n    }\n]"
             ,"");
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n        \"ExtendedPanId\": 1234,\n     },\n    {\n        \"Addr\": \"1234::5679\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net2\",\n        \"ExtendedPanId\": 1234,\n    }\n]"
             ,"");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c0,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"ExtendedPanId\": 1234,\n        \"NetworkName\": \"net2\",\n        \"DomainName\": \"dom1\"\n    },\n    {\n        \"Addr\": \"1234::5679\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net2\",\n        \"ExtendedPanId\": 1234,\n        \"DomainName\": \"dom2\"\n    }\n]"
             ,"");
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_200._M_p = (pointer)&local_1f0;
  local_208._0_4_ = kNone;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_1e0._M_p = (pointer)&local_1d0;
  local_1d8 = 0;
  local_1d0._M_local_buf[0] = '\0';
  paVar1 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_270,&local_180,&local_298);
  puVar2 = (undefined8 *)&local_2c8.mMessage.field_2;
  local_2c8._0_8_ = (ulong)(uint)local_2c8._4_4_ << 0x20;
  local_2c8.mMessage._M_string_length = 0;
  local_2c8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2c8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_2d8,"WriteFile(brJsonSameAddr, \"./tmp/json.json\")","Error{}",
             (Error *)local_270,&local_2c8);
  if (local_2c8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2c8.mMessage._M_dataplus._M_p);
  }
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_2d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if (local_2d0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x98f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_270 !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_270 + 8))();
    }
  }
  puVar3 = local_2d0;
  if (local_2d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d0 != local_2d0 + 2) {
      operator_delete((undefined8 *)*local_2d0);
    }
    operator_delete(puVar3);
  }
  local_270 = (undefined1  [8])local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_298,&local_160.mInterpreter,(string *)local_270);
  local_2c8.mMessage._M_string_length =
       (size_type)
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2c8.mMessage._M_dataplus._M_p =
       (pointer)local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8._0_8_ =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_298.field_2._M_allocated_capacity;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_298._M_dataplus._M_p;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_298._M_string_length;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_298);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_270,&local_160.mInterpreter,&local_228);
  local_208._0_4_ = local_270._0_4_;
  std::__cxx11::string::operator=((string *)&local_200,(string *)&local_268);
  std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_248);
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_208);
  local_2c8.mCode._0_1_ = !bVar5;
  local_2c8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&local_2c8,(AssertionResult *)0x2ddeee,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x992,(char *)local_270);
    testing::internal::AssertHelper::operator=(&local_2d8,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    if (local_270 != (undefined1  [8])local_260) {
      operator_delete((void *)local_270);
    }
    if ((long *)local_298._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_dataplus._M_p + 8))();
    }
    _Var4._M_p = local_2c8.mMessage._M_dataplus._M_p;
    if (local_2c8.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*local_2c8.mMessage._M_dataplus._M_p != local_2c8.mMessage._M_dataplus._M_p + 0x10) {
        operator_delete(*local_2c8.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_270,&local_1a0,&local_298);
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
  local_2c8.mMessage._M_string_length = 0;
  local_2c8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2c8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_2d8,
             "WriteFile(brJsonSameXPanDifferentNwkNames, \"./tmp/json.json\")","Error{}",
             (Error *)local_270,&local_2c8);
  if (local_2c8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2c8.mMessage._M_dataplus._M_p);
  }
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_2d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if (local_2d0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x994,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_270 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_270 + 8))();
    }
  }
  puVar3 = local_2d0;
  if (local_2d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d0 != local_2d0 + 2) {
      operator_delete((undefined8 *)*local_2d0);
    }
    operator_delete(puVar3);
  }
  local_270 = (undefined1  [8])local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_298,&local_160.mInterpreter,(string *)local_270);
  local_2c8.mMessage._M_string_length =
       (size_type)
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2c8.mMessage._M_dataplus._M_p =
       (pointer)local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8._0_8_ =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_298.field_2._M_allocated_capacity;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_298._M_dataplus._M_p;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_298._M_string_length;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_298);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_270,&local_160.mInterpreter,&local_228);
  local_208._0_4_ = local_270._0_4_;
  std::__cxx11::string::operator=((string *)&local_200,(string *)&local_268);
  std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_248);
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_208);
  local_2c8.mCode._0_1_ = !bVar5;
  local_2c8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&local_2c8,(AssertionResult *)0x2ddeee,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x997,(char *)local_270);
    testing::internal::AssertHelper::operator=(&local_2d8,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    if (local_270 != (undefined1  [8])local_260) {
      operator_delete((void *)local_270);
    }
    if ((long *)local_298._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_dataplus._M_p + 8))();
    }
    _Var4._M_p = local_2c8.mMessage._M_dataplus._M_p;
    if (local_2c8.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*local_2c8.mMessage._M_dataplus._M_p != local_2c8.mMessage._M_dataplus._M_p + 0x10) {
        operator_delete(*local_2c8.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
  }
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_270,&local_1c0,&local_298);
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
  local_2c8.mMessage._M_string_length = 0;
  local_2c8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2c8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_2d8,"WriteFile(brJsonSameXPanDifferentDomains, \"./tmp/json.json\")"
             ,"Error{}",(Error *)local_270,&local_2c8);
  if (local_2c8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2c8.mMessage._M_dataplus._M_p);
  }
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if (local_2d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_270);
    if (local_2d0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2d0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x999,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_270 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_270 + 8))();
    }
  }
  if (local_2d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2d0 != local_2d0 + 2) {
      operator_delete((undefined8 *)*local_2d0);
    }
    operator_delete(local_2d0);
  }
  local_270 = (undefined1  [8])local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_298,&local_160.mInterpreter,(string *)local_270);
  local_2c8.mMessage._M_string_length =
       (size_type)
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2c8.mMessage._M_dataplus._M_p =
       (pointer)local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8._0_8_ =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_298.field_2._M_allocated_capacity;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_298._M_dataplus._M_p;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_298._M_string_length;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_298);
  if (local_270 != (undefined1  [8])local_260) {
    operator_delete((void *)local_270);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_270,&local_160.mInterpreter,&local_228);
  local_208._0_4_ = local_270._0_4_;
  std::__cxx11::string::operator=((string *)&local_200,(string *)&local_268);
  std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_248);
  if (local_248._M_p != local_238) {
    operator_delete(local_248._M_p);
  }
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_208);
  local_2c8.mCode._0_1_ = !bVar5;
  local_2c8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_270,(internal *)&local_2c8,(AssertionResult *)0x2ddeee,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x99c,(char *)local_270);
    testing::internal::AssertHelper::operator=(&local_2d8,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    if (local_270 != (undefined1  [8])local_260) {
      operator_delete((void *)local_270);
    }
    if ((long *)local_298._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_298._M_dataplus._M_p + 8))();
    }
    _Var4._M_p = local_2c8.mMessage._M_dataplus._M_p;
    if (local_2c8.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*local_2c8.mMessage._M_dataplus._M_p != local_2c8.mMessage._M_dataplus._M_p + 0x10) {
        operator_delete(*local_2c8.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var4._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_p != &local_1d0) {
    operator_delete(local_1e0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrAddInterObjectInconsistencyFail)
{
    TestContext ctx;
    InitContext(ctx);

    std::string brJsonSameAddr                  = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
    }\n\
]";
    std::string brJsonSameXPanDifferentNwkNames = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
        \"ExtendedPanId\": 1234,\n\
     },\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": 1234,\n\
    }\n\
]";
    std::string brJsonSameXPanDifferentDomains  = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"ExtendedPanId\": 1234,\n\
        \"NetworkName\": \"net2\",\n\
        \"DomainName\": \"dom1\"\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": 1234,\n\
        \"DomainName\": \"dom2\"\n\
    }\n\
]";

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_EQ(WriteFile(brJsonSameAddr, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonSameXPanDifferentNwkNames, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonSameXPanDifferentDomains, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}